

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void out_ReplaceNode(FileStackNode *node)

{
  return;
}

Assistant:

void out_ReplaceNode(struct FileStackNode *node)
{
	(void)node;
#if 0
This is code intended to replace a node, which is pretty useless until ref counting is added...

	struct FileStackNode **ptr = &fileStackNodes;

	// The linked list is supposed to have decrementing IDs, so iterate with less memory reads,
	// to hopefully hit the cache less. A debug check is added after, in case a change is made
	// that breaks this assumption.
	for (uint32_t i = fileStackNodes->ID; i != node->ID; i--)
		ptr = &(*ptr)->next;
	assert((*ptr)->ID == node->ID);

	node->next = (*ptr)->next;
	assert(!node->next || node->next->ID == node->ID - 1); // Catch inconsistencies early
	// TODO: unreference the node
	*ptr = node;
#endif
}